

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<StatementAstNode>_> * __thiscall
Parser::parseAssignOrExpressionStatement
          (optional<std::shared_ptr<StatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  element_type *peVar2;
  element_type *peVar3;
  optional<std::shared_ptr<ExpressionStatementAstNode>_> local_98;
  optional<std::shared_ptr<AssignStatementAstNode>_> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  size_t lookAhead;
  shared_ptr<Token> local_28;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)&local_28);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_28);
  TVar1 = peVar2->tokenType;
  std::shared_ptr<Token>::~shared_ptr(&local_28);
  if (TVar1 == Identifier) {
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    while( true ) {
      peVar3 = std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      TokenBuffer::tokenAt((TokenBuffer *)local_58,(size_t)peVar3);
      peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_58);
      TVar1 = peVar2->tokenType;
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_58);
      if (TVar1 != WhiteSpace) break;
      local_58._16_8_ = (long)(_func_int ***)local_58._16_8_ + 1;
    }
    peVar3 = std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    TokenBuffer::tokenAt((TokenBuffer *)local_68,(size_t)peVar3);
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_68);
    TVar1 = peVar2->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
    if (TVar1 == Assign) {
      parseAssignStatement(&local_80,this);
      std::optional<std::shared_ptr<StatementAstNode>_>::
      optional<std::shared_ptr<AssignStatementAstNode>,_true>(__return_storage_ptr__,&local_80);
      std::optional<std::shared_ptr<AssignStatementAstNode>_>::~optional(&local_80);
    }
    else {
      parseExpressionStatement(&local_98,this);
      std::optional<std::shared_ptr<StatementAstNode>_>::
      optional<std::shared_ptr<ExpressionStatementAstNode>,_true>(__return_storage_ptr__,&local_98);
      std::optional<std::shared_ptr<ExpressionStatementAstNode>_>::~optional(&local_98);
    }
  }
  else {
    parseExpressionStatement
              ((optional<std::shared_ptr<ExpressionStatementAstNode>_> *)&lookAhead,this);
    std::optional<std::shared_ptr<StatementAstNode>_>::
    optional<std::shared_ptr<ExpressionStatementAstNode>,_true>
              (__return_storage_ptr__,
               (optional<std::shared_ptr<ExpressionStatementAstNode>_> *)&lookAhead);
    std::optional<std::shared_ptr<ExpressionStatementAstNode>_>::~optional
              ((optional<std::shared_ptr<ExpressionStatementAstNode>_> *)&lookAhead);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<StatementAstNode>>
Parser::parseAssignOrExpressionStatement() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    return this->parseExpressionStatement();
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::Assign) {
    return this->parseAssignStatement();
  }

  return this->parseExpressionStatement();
}